

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

Collision * __thiscall
Sphere::collide(Collision *__return_storage_ptr__,Sphere *this,Vector3 *start,Vector3 *dir)

{
  Vector3 *A;
  bool in;
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3 d;
  Vector3 p;
  Vector3 oc;
  Vector3 local_90;
  Vector3 local_78;
  Vector3 local_60;
  Vector3 local_48;
  
  Vector3::unitize(dir);
  A = &this->m_o;
  operator-(A,start);
  dVar1 = Vector3::dot(&local_48,&local_90);
  if (1e-06 < dVar1) {
    dVar3 = this->m_r;
    dVar2 = Vector3::mod2(&local_48);
    dVar3 = dVar1 * dVar1 + (dVar3 * dVar3 - dVar2);
    if (1e-06 < dVar3) {
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar2 = dVar1 - dVar3;
      if (dVar2 <= 1e-06) {
        dVar2 = dVar1 + dVar3;
        if (dVar2 <= 1e-06) goto LAB_00105dc3;
        Vector3::operator*(&local_78,&local_90,dVar2);
        operator+(start,&local_78);
        operator-(A,&local_60);
        in = true;
      }
      else {
        Vector3::operator*(&local_78,&local_90,dVar2);
        operator+(start,&local_78);
        operator-(&local_60,A);
        in = false;
      }
      Collision::Collision
                (__return_storage_ptr__,start,&local_90,dVar2,&local_78,in,&this->super_Object);
      return __return_storage_ptr__;
    }
  }
LAB_00105dc3:
  Collision::Collision(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Collision Sphere::collide(const Vector3& start, const Vector3& dir) const
{
    Vector3 d = dir.unitize();
    Vector3 oc = m_o - start;
    double tca = oc.dot(d);
    if (tca > Const::EPS)
    {
        double thc2 = m_r * m_r - oc.mod2() + tca * tca;
        if (thc2 > Const::EPS)
        {
            double thc = sqrt(thc2), t1 = tca - thc, t2 = tca + thc;
            if (t1 > Const::EPS)
            {
                Vector3 p = start + d * t1;
                return Collision(start, d, t1, p - m_o, false, this);
            }
            else if (t2 > Const::EPS)
            {
                Vector3 p = start + d * t2;
                return Collision(start, d, t2, m_o - p, true, this);
            }
        }
    }

    return Collision();
}